

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpdatableNeuralNetworkValidator.cpp
# Opt level: O3

Result * validateUpdatableNeuralNetwork<CoreML::Specification::NeuralNetworkClassifier>
                   (Result *__return_storage_ptr__,NeuralNetworkClassifier *nn)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint32 uVar2;
  string *psVar3;
  pointer pcVar4;
  LayerNode *pLVar5;
  bool bVar6;
  Type *pTVar7;
  const_iterator cVar8;
  long *plVar9;
  Type *pTVar10;
  NetworkUpdateParameters *pNVar11;
  long lVar12;
  LayerNode *pLVar13;
  iterator iVar14;
  undefined8 extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  size_type *psVar16;
  long *plVar17;
  ulong *puVar18;
  int iVar19;
  uint uVar20;
  Optimizer *optimizer;
  ulong uVar21;
  string err_1;
  string layerName;
  string firstNonBackpropogabaleLayerSeen;
  string lossLayerName_1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  visitedLayersSet;
  string err_4;
  Result r;
  string err_3;
  string err;
  string currentNodeName;
  vector<CoreML::LayerNode,_std::allocator<CoreML::LayerNode>_> layerNodes;
  undefined1 local_2e8 [8];
  _Alloc_hider local_2e0;
  undefined1 local_2d8 [24];
  undefined1 local_2c0 [8];
  _Alloc_hider local_2b8;
  undefined1 local_2b0 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  value_type local_278;
  RepeatedPtrFieldBase *local_258;
  undefined1 local_250 [8];
  undefined1 local_248 [32];
  size_t local_228;
  NetworkUpdateParameters *local_220;
  string local_218;
  undefined1 local_1f8 [8];
  undefined1 auStack_1f0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_1e0;
  pointer ppLStack_1d0;
  _Base_ptr local_1c8;
  _Alloc_hider _Stack_1c0;
  _Elt_pointer local_1b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_1b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_188;
  string local_168;
  undefined1 local_148 [8];
  _Alloc_hider local_140;
  undefined1 local_138 [24];
  size_t local_120;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::LayerNode_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::LayerNode_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::LayerNode_*>_>_>
  local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  string *local_c8;
  _Base_ptr local_c0;
  string local_b8;
  vector<CoreML::LayerNode,_std::allocator<CoreML::LayerNode>_> local_98;
  ulong local_80;
  _Base_ptr local_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  CoreML::Result::Result(__return_storage_ptr__);
  CoreML::Result::Result((Result *)local_1f8);
  if ((nn->layers_).super_RepeatedPtrFieldBase.current_size_ < 1) {
LAB_002aa5bd:
    local_148 = (undefined1  [8])local_138;
    local_140._M_p = (pointer)0x0;
    local_138._0_8_ = local_138._0_8_ & 0xffffffffffffff00;
    std::__cxx11::string::_M_replace((ulong)local_148,0,(char *)0x0,0x3496e3);
    CoreML::Result::Result
              ((Result *)local_250,INVALID_UPDATABLE_MODEL_PARAMETERS,(string *)local_148);
LAB_002aa60d:
    if (local_148 != (undefined1  [8])local_138) {
      operator_delete((void *)local_148,(ulong)(local_138._0_8_ + 1));
    }
  }
  else {
    bVar6 = false;
    iVar19 = 0;
    do {
      while (pTVar7 = google::protobuf::internal::RepeatedPtrFieldBase::
                      Get<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                                (&(nn->layers_).super_RepeatedPtrFieldBase,iVar19),
            pTVar7->isupdatable_ == true) {
        uVar2 = pTVar7->_oneof_case_[0];
        if (((uVar2 != 100) && (uVar2 != 0x8c)) && (uVar2 != 0x1a4)) {
          local_148 = (undefined1  [8])local_138;
          local_140._M_p = (pointer)0x0;
          local_138._0_8_ = local_138._0_8_ & 0xffffffffffffff00;
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_2c0,"The layer named \'",(pTVar7->name_).ptr_);
          plVar9 = (long *)std::__cxx11::string::append(local_2c0);
          puVar18 = (ulong *)(plVar9 + 2);
          if ((ulong *)*plVar9 == puVar18) {
            local_2d8._0_8_ = *puVar18;
            local_2d8._8_8_ = plVar9[3];
            local_2e8 = (undefined1  [8])local_2d8;
          }
          else {
            local_2d8._0_8_ = *puVar18;
            local_2e8 = (undefined1  [8])*plVar9;
          }
          local_2e0._M_p = (pointer)plVar9[1];
          *plVar9 = (long)puVar18;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          std::__cxx11::string::operator=((string *)local_148,(string *)local_2e8);
          if (local_2e8 != (undefined1  [8])local_2d8) {
            operator_delete((void *)local_2e8,(ulong)(local_2d8._0_8_ + 1));
          }
          if (local_2c0 != (undefined1  [8])local_2b0) {
            operator_delete((void *)local_2c0,(ulong)(local_2b0._0_8_ + 1));
          }
          CoreML::Result::Result
                    ((Result *)local_250,INVALID_UPDATABLE_MODEL_PARAMETERS,(string *)local_148);
          goto LAB_002aa60d;
        }
        validateWeightParamsUpdatable((Result *)local_148,pTVar7);
        local_1f8 = local_148;
        std::__cxx11::string::operator=((string *)auStack_1f0,(string *)&local_140);
        if (local_140._M_p != local_138 + 8) {
          operator_delete(local_140._M_p,(ulong)(local_138._8_8_ + 1));
        }
        bVar6 = CoreML::Result::good((Result *)local_1f8);
        if (!bVar6) goto LAB_002aa57a;
        iVar19 = iVar19 + 1;
        bVar6 = true;
        if ((nn->layers_).super_RepeatedPtrFieldBase.current_size_ <= iVar19) goto LAB_002aa57a;
      }
      iVar19 = iVar19 + 1;
    } while (iVar19 < (nn->layers_).super_RepeatedPtrFieldBase.current_size_);
    if (!bVar6) goto LAB_002aa5bd;
LAB_002aa57a:
    local_248._0_8_ = local_248 + 0x10;
    local_250 = local_1f8;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)auStack_1f0._0_8_ == &aStack_1e0) {
      local_248._24_8_ = aStack_1e0._8_8_;
    }
    else {
      local_248._0_8_ = auStack_1f0._0_8_;
    }
    local_248._16_8_ = aStack_1e0._M_allocated_capacity;
    local_248._8_8_ = auStack_1f0._8_8_;
    auStack_1f0._8_8_ = (_Base_ptr)0x0;
    aStack_1e0._M_allocated_capacity = aStack_1e0._M_allocated_capacity & 0xffffffffffffff00;
    auStack_1f0._0_8_ = &aStack_1e0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)auStack_1f0._0_8_ != &aStack_1e0) {
    operator_delete((void *)auStack_1f0._0_8_,(ulong)(aStack_1e0._M_allocated_capacity + 1));
  }
  __return_storage_ptr__->m_type = local_250._0_4_;
  __return_storage_ptr__->m_reason = local_250._4_4_;
  local_c8 = (string *)&__return_storage_ptr__->m_message;
  std::__cxx11::string::operator=(local_c8,(string *)local_248);
  if ((undefined1 *)local_248._0_8_ != local_248 + 0x10) {
    operator_delete((void *)local_248._0_8_,(ulong)(local_248._16_8_ + 1));
  }
  bVar6 = CoreML::Result::good(__return_storage_ptr__);
  if (!bVar6) {
    return __return_storage_ptr__;
  }
  CoreML::Result::Result((Result *)local_148);
  aStack_1e0._M_allocated_capacity = (size_type)auStack_1f0;
  auStack_1f0._0_8_ = auStack_1f0._0_8_ & 0xffffffff00000000;
  iVar19 = 0;
  auStack_1f0._8_8_ = (_Base_ptr)0x0;
  ppLStack_1d0 = (pointer)0x0;
  local_2e8 = (undefined1  [8])local_2d8;
  local_2e0._M_p = (pointer)0x0;
  local_2d8._0_8_ = local_2d8._0_8_ & 0xffffffffffffff00;
  aStack_1e0._8_8_ = aStack_1e0._M_allocated_capacity;
  if (0 < (nn->layers_).super_RepeatedPtrFieldBase.current_size_) {
    do {
      pTVar7 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                         (&(nn->layers_).super_RepeatedPtrFieldBase,iVar19);
      psVar3 = (pTVar7->name_).ptr_;
      local_2c0 = (undefined1  [8])local_2b0;
      pcVar4 = (psVar3->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_2c0,pcVar4,pcVar4 + psVar3->_M_string_length);
      cVar8 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_1f8,(key_type *)local_2c0);
      if (cVar8._M_node == (_Base_ptr)auStack_1f0) {
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)local_1f8,(key_type *)local_2c0);
      }
      else {
        std::operator+(&local_298,"The updatable model has a name collision for: \'",
                       (key_type *)local_2c0);
        plVar9 = (long *)std::__cxx11::string::append((char *)&local_298);
        psVar16 = (size_type *)(plVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar16) {
          local_278.field_2._M_allocated_capacity = *psVar16;
          local_278.field_2._8_8_ = plVar9[3];
          local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
        }
        else {
          local_278.field_2._M_allocated_capacity = *psVar16;
          local_278._M_dataplus._M_p = (pointer)*plVar9;
        }
        local_278._M_string_length = plVar9[1];
        *plVar9 = (long)psVar16;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        std::__cxx11::string::operator=((string *)local_2e8,(string *)&local_278);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_dataplus._M_p != &local_278.field_2) {
          operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._M_dataplus._M_p != &local_298.field_2) {
          operator_delete(local_298._M_dataplus._M_p,
                          CONCAT71(local_298.field_2._M_allocated_capacity._1_7_,
                                   local_298.field_2._M_local_buf[0]) + 1);
        }
        CoreML::Result::Result
                  ((Result *)local_250,INVALID_UPDATABLE_MODEL_PARAMETERS,(string *)local_2e8);
      }
      if (local_2c0 != (undefined1  [8])local_2b0) {
        operator_delete((void *)local_2c0,(ulong)(local_2b0._0_8_ + 1));
      }
      if (cVar8._M_node != (_Base_ptr)auStack_1f0) goto LAB_002aaaf7;
      iVar19 = iVar19 + 1;
    } while (iVar19 < (nn->layers_).super_RepeatedPtrFieldBase.current_size_);
  }
  local_220 = nn->updateparams_;
  if (local_220 == (NetworkUpdateParameters *)0x0) {
    local_220 = (NetworkUpdateParameters *)
                &CoreML::Specification::_NetworkUpdateParameters_default_instance_;
  }
  if (0 < (local_220->losslayers_).super_RepeatedPtrFieldBase.current_size_) {
    local_258 = &(local_220->losslayers_).super_RepeatedPtrFieldBase;
    iVar19 = 0;
    do {
      pTVar10 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<CoreML::Specification::LossLayer>::TypeHandler>
                          (local_258,iVar19);
      psVar3 = (pTVar10->name_).ptr_;
      local_2c0 = (undefined1  [8])local_2b0;
      pcVar4 = (psVar3->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_2c0,pcVar4,pcVar4 + psVar3->_M_string_length);
      cVar8 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_1f8,(key_type *)local_2c0);
      if (cVar8._M_node == (_Base_ptr)auStack_1f0) {
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)local_1f8,(key_type *)local_2c0);
      }
      else {
        std::operator+(&local_298,"The updatable model has a name collision for: \'",
                       (key_type *)local_2c0);
        plVar9 = (long *)std::__cxx11::string::append((char *)&local_298);
        psVar16 = (size_type *)(plVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar16) {
          local_278.field_2._M_allocated_capacity = *psVar16;
          local_278.field_2._8_8_ = plVar9[3];
          local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
        }
        else {
          local_278.field_2._M_allocated_capacity = *psVar16;
          local_278._M_dataplus._M_p = (pointer)*plVar9;
        }
        local_278._M_string_length = plVar9[1];
        *plVar9 = (long)psVar16;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        std::__cxx11::string::operator=((string *)local_2e8,(string *)&local_278);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_dataplus._M_p != &local_278.field_2) {
          operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._M_dataplus._M_p != &local_298.field_2) {
          operator_delete(local_298._M_dataplus._M_p,
                          CONCAT71(local_298.field_2._M_allocated_capacity._1_7_,
                                   local_298.field_2._M_local_buf[0]) + 1);
        }
        CoreML::Result::Result
                  ((Result *)local_250,INVALID_UPDATABLE_MODEL_PARAMETERS,(string *)local_2e8);
      }
      if (local_2c0 != (undefined1  [8])local_2b0) {
        operator_delete((void *)local_2c0,(ulong)(local_2b0._0_8_ + 1));
      }
      if (cVar8._M_node != (_Base_ptr)auStack_1f0) goto LAB_002aaaf7;
      iVar19 = iVar19 + 1;
    } while (iVar19 < (local_220->losslayers_).super_RepeatedPtrFieldBase.current_size_);
  }
  local_250 = local_148;
  local_248._0_8_ = local_248 + 0x10;
  if (local_140._M_p == local_138 + 8) {
    local_248._24_8_ = local_138._16_8_;
  }
  else {
    local_248._0_8_ = local_140._M_p;
  }
  local_248._16_8_ = local_138._8_8_;
  local_248._8_8_ = local_138._0_8_;
  local_138._0_8_ = (pointer)0x0;
  local_138._8_8_ = local_138._8_8_ & 0xffffffffffffff00;
  local_140._M_p = local_138 + 8;
LAB_002aaaf7:
  if (local_2e8 != (undefined1  [8])local_2d8) {
    operator_delete((void *)local_2e8,(ulong)(local_2d8._0_8_ + 1));
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_1f8);
  if (local_140._M_p != local_138 + 8) {
    operator_delete(local_140._M_p,(ulong)(local_138._8_8_ + 1));
  }
  __return_storage_ptr__->m_type = local_250._0_4_;
  __return_storage_ptr__->m_reason = local_250._4_4_;
  std::__cxx11::string::operator=(local_c8,(string *)local_248);
  if ((undefined1 *)local_248._0_8_ != local_248 + 0x10) {
    operator_delete((void *)local_248._0_8_,(ulong)(local_248._16_8_ + 1));
  }
  bVar6 = CoreML::Result::good(__return_storage_ptr__);
  if (!bVar6) {
    return __return_storage_ptr__;
  }
  CoreML::Result::Result((Result *)local_2e8);
  pNVar11 = nn->updateparams_;
  if (pNVar11 == (NetworkUpdateParameters *)0x0) {
    pNVar11 = (NetworkUpdateParameters *)
              &CoreML::Specification::_NetworkUpdateParameters_default_instance_;
  }
  lVar12 = (long)(pNVar11->losslayers_).super_RepeatedPtrFieldBase.current_size_;
  if (1 < lVar12) {
    auStack_1f0._0_8_ = (pointer)0x0;
    auStack_1f0._8_8_ = auStack_1f0._8_8_ & 0xffffffffffffff00;
    local_1f8 = (undefined1  [8])(auStack_1f0 + 8);
    std::__cxx11::string::_M_replace((ulong)local_1f8,0,(char *)0x0,0x349851);
    CoreML::Result::Result
              ((Result *)local_2c0,INVALID_UPDATABLE_MODEL_CONFIGURATION,(string *)local_1f8);
    if (local_1f8 != (undefined1  [8])(auStack_1f0 + 8)) {
      operator_delete((void *)local_1f8,(ulong)(auStack_1f0._8_8_ + 1));
    }
    goto LAB_002ab67c;
  }
  local_138._8_8_ = &local_140;
  local_140._M_p = local_140._M_p & 0xffffffff00000000;
  local_138._0_8_ = (pointer)0x0;
  local_120 = 0;
  local_118._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_118._M_impl.super__Rb_tree_header._M_header;
  local_118._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_118._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_118._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_98.super__Vector_base<CoreML::LayerNode,_std::allocator<CoreML::LayerNode>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98.super__Vector_base<CoreML::LayerNode,_std::allocator<CoreML::LayerNode>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.super__Vector_base<CoreML::LayerNode,_std::allocator<CoreML::LayerNode>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_138._16_8_ = local_138._8_8_;
  local_118._M_impl.super__Rb_tree_header._M_header._M_right =
       local_118._M_impl.super__Rb_tree_header._M_header._M_left;
  std::vector<CoreML::LayerNode,_std::allocator<CoreML::LayerNode>_>::resize
            (&local_98,(nn->layers_).super_RepeatedPtrFieldBase.current_size_ + lVar12);
  if (0 < (nn->layers_).super_RepeatedPtrFieldBase.current_size_) {
    iVar19 = 0;
    do {
      pTVar7 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                         (&(nn->layers_).super_RepeatedPtrFieldBase,iVar19);
      CoreML::LayerNode::LayerNode((LayerNode *)local_1f8,pTVar7);
      std::vector<CoreML::LayerNode,_std::allocator<CoreML::LayerNode>_>::
      emplace_back<CoreML::LayerNode>(&local_98,(LayerNode *)local_1f8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_188);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_1a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Stack_1c0._M_p != &aStack_1b0) {
        operator_delete(_Stack_1c0._M_p,aStack_1b0._M_allocated_capacity + 1);
      }
      if ((_Alloc_hider *)aStack_1e0._M_allocated_capacity != (_Alloc_hider *)0x0) {
        operator_delete((void *)aStack_1e0._M_allocated_capacity,
                        (long)ppLStack_1d0 - aStack_1e0._0_8_);
      }
      if (local_1f8 != (undefined1  [8])0x0) {
        operator_delete((void *)local_1f8,auStack_1f0._8_8_ - (long)local_1f8);
      }
      CoreML::NeuralNetworkValidatorGraph::insertNode
                ((NeuralNetworkValidatorGraph *)local_148,
                 local_98.super__Vector_base<CoreML::LayerNode,_std::allocator<CoreML::LayerNode>_>.
                 _M_impl.super__Vector_impl_data._M_finish + -1);
      iVar19 = iVar19 + 1;
    } while (iVar19 < (nn->layers_).super_RepeatedPtrFieldBase.current_size_);
  }
  pNVar11 = nn->updateparams_;
  if (pNVar11 == (NetworkUpdateParameters *)0x0) {
    pNVar11 = (NetworkUpdateParameters *)
              &CoreML::Specification::_NetworkUpdateParameters_default_instance_;
  }
  if (0 < (pNVar11->losslayers_).super_RepeatedPtrFieldBase.current_size_) {
    iVar19 = 0;
    do {
      pTVar10 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<CoreML::Specification::LossLayer>::TypeHandler>
                          (&(pNVar11->losslayers_).super_RepeatedPtrFieldBase,iVar19);
      CoreML::LayerNode::LayerNode((LayerNode *)local_1f8,pTVar10);
      std::vector<CoreML::LayerNode,_std::allocator<CoreML::LayerNode>_>::
      emplace_back<CoreML::LayerNode>(&local_98,(LayerNode *)local_1f8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_188);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_1a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Stack_1c0._M_p != &aStack_1b0) {
        operator_delete(_Stack_1c0._M_p,aStack_1b0._M_allocated_capacity + 1);
      }
      if ((_Alloc_hider *)aStack_1e0._M_allocated_capacity != (_Alloc_hider *)0x0) {
        operator_delete((void *)aStack_1e0._M_allocated_capacity,
                        (long)ppLStack_1d0 - aStack_1e0._0_8_);
      }
      if (local_1f8 != (undefined1  [8])0x0) {
        operator_delete((void *)local_1f8,auStack_1f0._8_8_ - (long)local_1f8);
      }
      CoreML::NeuralNetworkValidatorGraph::insertNode
                ((NeuralNetworkValidatorGraph *)local_148,
                 local_98.super__Vector_base<CoreML::LayerNode,_std::allocator<CoreML::LayerNode>_>.
                 _M_impl.super__Vector_impl_data._M_finish + -1);
      validateLossLayer((Result *)local_1f8,pTVar10,(NeuralNetworkValidatorGraph *)local_148);
      local_2e8 = local_1f8;
      std::__cxx11::string::operator=((string *)&local_2e0,(string *)auStack_1f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)auStack_1f0._0_8_ != &aStack_1e0) {
        operator_delete((void *)auStack_1f0._0_8_,(ulong)(aStack_1e0._M_allocated_capacity + 1));
      }
      bVar6 = CoreML::Result::good((Result *)local_2e8);
      if (!bVar6) goto LAB_002ab602;
      pNVar11 = nn->updateparams_;
      if (pNVar11 == (NetworkUpdateParameters *)0x0) {
        pNVar11 = (NetworkUpdateParameters *)
                  &CoreML::Specification::_NetworkUpdateParameters_default_instance_;
      }
      iVar19 = iVar19 + 1;
    } while (iVar19 < (pNVar11->losslayers_).super_RepeatedPtrFieldBase.current_size_);
  }
  optimizer = pNVar11->optimizer_;
  if (optimizer == (Optimizer *)0x0) {
    optimizer = (Optimizer *)&CoreML::Specification::_Optimizer_default_instance_;
  }
  validateOptimizer((Result *)local_1f8,optimizer);
  local_2e8 = local_1f8;
  std::__cxx11::string::operator=((string *)&local_2e0,(string *)auStack_1f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)auStack_1f0._0_8_ != &aStack_1e0) {
    operator_delete((void *)auStack_1f0._0_8_,(ulong)(aStack_1e0._M_allocated_capacity + 1));
  }
  bVar6 = CoreML::Result::good((Result *)local_2e8);
  if (bVar6) {
    pNVar11 = nn->updateparams_;
    if (pNVar11 == (NetworkUpdateParameters *)0x0) {
      pNVar11 = (NetworkUpdateParameters *)
                &CoreML::Specification::_NetworkUpdateParameters_default_instance_;
    }
    validateOtherTopLevelUpdateParameters((Result *)local_1f8,pNVar11);
    local_2e8 = local_1f8;
    std::__cxx11::string::operator=((string *)&local_2e0,(string *)auStack_1f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)auStack_1f0._0_8_ != &aStack_1e0) {
      operator_delete((void *)auStack_1f0._0_8_,(ulong)(aStack_1e0._M_allocated_capacity + 1));
    }
    bVar6 = CoreML::Result::good((Result *)local_2e8);
    if (!bVar6) goto LAB_002ab602;
    local_248._0_8_ = local_248._0_8_ & 0xffffffff00000000;
    local_248._8_8_ = (_Base_ptr)0x0;
    local_248._16_8_ = local_248;
    local_228 = 0;
    pNVar11 = nn->updateparams_;
    if (pNVar11 == (NetworkUpdateParameters *)0x0) {
      pNVar11 = (NetworkUpdateParameters *)
                &CoreML::Specification::_NetworkUpdateParameters_default_instance_;
    }
    local_248._24_8_ = local_248._16_8_;
    if (0 < (pNVar11->losslayers_).super_RepeatedPtrFieldBase.current_size_) {
      paVar1 = &local_168.field_2;
      uVar21 = 0;
      do {
        local_80 = uVar21;
        pTVar10 = google::protobuf::internal::RepeatedPtrFieldBase::
                  Get<google::protobuf::RepeatedPtrField<CoreML::Specification::LossLayer>::TypeHandler>
                            (&(pNVar11->losslayers_).super_RepeatedPtrFieldBase,(int)uVar21);
        psVar3 = (pTVar10->name_).ptr_;
        local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
        pcVar4 = (psVar3->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_278,pcVar4,pcVar4 + psVar3->_M_string_length);
        local_1b8 = (_Elt_pointer)0x0;
        aStack_1b0._M_allocated_capacity = 0;
        local_1c8 = (_Base_ptr)0x0;
        _Stack_1c0._M_p = (pointer)0x0;
        aStack_1e0._8_8_ = (_Alloc_hider *)0x0;
        ppLStack_1d0 = (pointer)0x0;
        auStack_1f0._8_8_ = (_Base_ptr)0x0;
        aStack_1e0._M_allocated_capacity = 0;
        local_1f8 = (undefined1  [8])0x0;
        auStack_1f0._0_8_ = (pointer)0x0;
        std::
        _Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_initialize_map((_Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_1f8,0);
        std::
        deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_1f8,&local_278);
        local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
        local_298._M_string_length = 0;
        local_298.field_2._M_local_buf[0] = '\0';
        local_258 = (RepeatedPtrFieldBase *)((ulong)local_258 & 0xffffffff00000000);
        do {
          local_c0 = (_Base_ptr)auStack_1f0._8_8_;
          local_78 = local_1c8;
          if (local_1c8 == (_Base_ptr)auStack_1f0._8_8_) break;
          local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_e8,*(long *)auStack_1f0._8_8_,
                     (long)&(*(_Base_ptr *)(auStack_1f0._8_8_ + 8))->_M_color +
                     *(long *)auStack_1f0._8_8_);
          std::
          deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::pop_front((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_1f8);
          local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_b8,local_e8._M_dataplus._M_p,
                     local_e8._M_dataplus._M_p + local_e8._M_string_length);
          pLVar13 = CoreML::NeuralNetworkValidatorGraph::getNodeFromName
                              ((NeuralNetworkValidatorGraph *)local_148,&local_b8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
            operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
          }
          if (pLVar13 == (LayerNode *)0x0) {
            std::operator+(&local_218,"Failed to look up node for \'",&local_e8);
            plVar9 = (long *)std::__cxx11::string::append((char *)&local_218);
            psVar16 = (size_type *)(plVar9 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar9 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar16) {
              local_168.field_2._M_allocated_capacity = *psVar16;
              local_168.field_2._8_8_ = plVar9[3];
              local_168._M_dataplus._M_p = (pointer)paVar1;
            }
            else {
              local_168.field_2._M_allocated_capacity = *psVar16;
              local_168._M_dataplus._M_p = (pointer)*plVar9;
            }
            local_168._M_string_length = plVar9[1];
            *plVar9 = (long)psVar16;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_218._M_dataplus._M_p != &local_218.field_2) {
              operator_delete(local_218._M_dataplus._M_p,
                              CONCAT71(local_218.field_2._M_allocated_capacity._1_7_,
                                       local_218.field_2._M_local_buf[0]) + 1);
            }
            CoreML::Result::Result
                      ((Result *)local_2c0,INVALID_UPDATABLE_MODEL_CONFIGURATION,&local_168);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_168._M_dataplus._M_p != paVar1) {
              operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1
                             );
            }
            bVar6 = false;
          }
          else {
            pNVar11 = (NetworkUpdateParameters *)
                      (pLVar13->parents).
                      super__Vector_base<CoreML::LayerNode_*,_std::allocator<CoreML::LayerNode_*>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            local_220 = (NetworkUpdateParameters *)
                        (pLVar13->parents).
                        super__Vector_base<CoreML::LayerNode_*,_std::allocator<CoreML::LayerNode_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
            if (pNVar11 == local_220) {
              bVar6 = true;
            }
            else {
              do {
                pLVar5 = (LayerNode *)(pNVar11->super_MessageLite)._vptr_MessageLite;
                pcVar4 = (pLVar5->name)._M_dataplus._M_p;
                local_168._M_dataplus._M_p = (pointer)paVar1;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_168,pcVar4,pcVar4 + (pLVar5->name)._M_string_length);
                iVar14 = std::
                         _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_250,&local_168);
                iVar19 = 0xe;
                if (iVar14._M_node == (_Base_ptr)local_248) {
                  std::
                  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  ::_M_insert_unique<std::__cxx11::string_const&>
                            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                              *)local_250,&local_168);
                  std::
                  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::push_back((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_1f8,&local_168);
                  if ((pLVar5->isUpdatable & (byte)local_258) == 1) {
                    local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
                    local_218._M_string_length = 0;
                    local_218.field_2._M_local_buf[0] = '\0';
                    std::operator+(&local_50,"There is a layer (",&local_298);
                    plVar9 = (long *)std::__cxx11::string::append((char *)&local_50);
                    plVar17 = plVar9 + 2;
                    if ((long *)*plVar9 == plVar17) {
                      local_60 = *plVar17;
                      lStack_58 = plVar9[3];
                      local_70 = &local_60;
                    }
                    else {
                      local_60 = *plVar17;
                      local_70 = (long *)*plVar9;
                    }
                    local_68 = plVar9[1];
                    *plVar9 = (long)plVar17;
                    plVar9[1] = 0;
                    *(undefined1 *)(plVar9 + 2) = 0;
                    std::__cxx11::string::operator=((string *)&local_218,(string *)&local_70);
                    if (local_70 != &local_60) {
                      operator_delete(local_70,local_60 + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_50._M_dataplus._M_p != &local_50.field_2) {
                      operator_delete(local_50._M_dataplus._M_p,
                                      local_50.field_2._M_allocated_capacity + 1);
                    }
                    CoreML::Result::Result
                              ((Result *)local_2c0,INVALID_UPDATABLE_MODEL_CONFIGURATION,&local_218)
                    ;
                    paVar15 = &local_218.field_2;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_218._M_dataplus._M_p != paVar15) {
                      operator_delete(local_218._M_dataplus._M_p,
                                      CONCAT71(local_218.field_2._M_allocated_capacity._1_7_,
                                               local_218.field_2._M_local_buf[0]) + 1);
                      paVar15 = extraout_RAX_00;
                    }
                    iVar19 = 1;
                    local_258 = (RepeatedPtrFieldBase *)
                                CONCAT44(local_258._4_4_,
                                         (int)CONCAT71((int7)((ulong)paVar15 >> 8),1));
                  }
                  else if (pLVar5->isBackPropagable == false) {
                    if ((pLVar5->layerType != kSoftmax) ||
                       (pLVar13->lossLayerType != kCategoricalCrossEntropyLossLayer)) {
                      local_258 = (RepeatedPtrFieldBase *)
                                  CONCAT44(local_258._4_4_,
                                           (int)CONCAT71((int7)((ulong)extraout_RAX >> 8),1));
                      std::__cxx11::string::_M_assign((string *)&local_298);
                      iVar19 = 0;
                    }
                  }
                  else {
                    iVar19 = 0;
                  }
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_168._M_dataplus._M_p != paVar1) {
                  operator_delete(local_168._M_dataplus._M_p,
                                  local_168.field_2._M_allocated_capacity + 1);
                }
                if ((iVar19 != 0xe) && (iVar19 != 0)) goto LAB_002ab41e;
                pNVar11 = (NetworkUpdateParameters *)&pNVar11->_internal_metadata_;
              } while (pNVar11 != local_220);
              iVar19 = 0;
LAB_002ab41e:
              bVar6 = iVar19 == 0;
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
            operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
          }
        } while (bVar6);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._M_dataplus._M_p != &local_298.field_2) {
          operator_delete(local_298._M_dataplus._M_p,
                          CONCAT71(local_298.field_2._M_allocated_capacity._1_7_,
                                   local_298.field_2._M_local_buf[0]) + 1);
        }
        std::
        deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_1f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_dataplus._M_p != &local_278.field_2) {
          operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
        }
        if (local_78 != local_c0) goto LAB_002ab778;
        pNVar11 = nn->updateparams_;
        if (pNVar11 == (NetworkUpdateParameters *)0x0) {
          pNVar11 = (NetworkUpdateParameters *)
                    &CoreML::Specification::_NetworkUpdateParameters_default_instance_;
        }
        uVar20 = (int)local_80 + 1;
        uVar21 = (ulong)uVar20;
      } while ((int)uVar20 < (pNVar11->losslayers_).super_RepeatedPtrFieldBase.current_size_);
    }
    local_2b8._M_p = local_2b0 + 8;
    local_2c0 = local_2e8;
    if (local_2e0._M_p == local_2d8 + 8) {
      local_2b0._16_8_ = local_2d8._16_8_;
    }
    else {
      local_2b8._M_p = local_2e0._M_p;
    }
    local_2b0._8_8_ = local_2d8._8_8_;
    local_2b0._0_8_ = local_2d8._0_8_;
    local_2d8._0_8_ = (pointer)0x0;
    local_2d8._8_8_ = local_2d8._8_8_ & 0xffffffffffffff00;
    local_2e0._M_p = local_2d8 + 8;
LAB_002ab778:
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_250);
  }
  else {
LAB_002ab602:
    local_2b8._M_p = local_2b0 + 8;
    local_2c0 = local_2e8;
    if (local_2e0._M_p == local_2d8 + 8) {
      local_2b0._16_8_ = local_2d8._16_8_;
    }
    else {
      local_2b8._M_p = local_2e0._M_p;
    }
    local_2b0._8_8_ = local_2d8._8_8_;
    local_2b0._0_8_ = local_2d8._0_8_;
    local_2d8._0_8_ = (pointer)0x0;
    local_2d8._8_8_ = local_2d8._8_8_ & 0xffffffffffffff00;
    local_2e0._M_p = local_2d8 + 8;
  }
  std::vector<CoreML::LayerNode,_std::allocator<CoreML::LayerNode>_>::~vector(&local_98);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::LayerNode_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::LayerNode_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::LayerNode_*>_>_>
  ::~_Rb_tree(&local_118);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::LayerNode_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::LayerNode_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::LayerNode_*>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::LayerNode_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::LayerNode_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::LayerNode_*>_>_>
               *)local_148);
LAB_002ab67c:
  if (local_2e0._M_p != local_2d8 + 8) {
    operator_delete(local_2e0._M_p,local_2d8._8_8_ + 1);
  }
  __return_storage_ptr__->m_type = local_2c0._0_4_;
  __return_storage_ptr__->m_reason = local_2c0._4_4_;
  std::__cxx11::string::operator=(local_c8,(string *)&local_2b8);
  if (local_2b8._M_p != local_2b0 + 8) {
    operator_delete(local_2b8._M_p,local_2b0._8_8_ + 1);
  }
  CoreML::Result::good(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Result validateUpdatableNeuralNetwork(const T& nn) {
    
    Result r;

    r = validateUpdatableLayerSupport(nn);
    if (!r.good()) {return r;}
    
    r = validateLayerAndLossLayerNamesCollisions(nn);
    if (!r.good()) {return r;}

    r = isTrainingConfigurationSupported(nn);
    if (!r.good()) {return r;}
    
    return r;
}